

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

int GmfWriteByteFlow(int64_t MshIdx,char *BytTab,int NmbByt)

{
  int iVar1;
  int iVar2;
  uint in_EDX;
  long in_RSI;
  int64_t in_RDI;
  int NmbWrd;
  int *WrdTab;
  int PadWrd;
  int i;
  uint local_24;
  int local_20;
  int local_4;
  
  iVar1 = (int)in_EDX / 4;
  local_24 = (uint)(iVar1 * 4 < (int)in_EDX);
  iVar2 = GmfSetKwd(in_RDI,0x7e,(long)(int)(iVar1 + local_24));
  if (iVar2 == 0) {
    local_4 = 0;
  }
  else {
    GmfSetLin(in_RDI,0x7e,(ulong)in_EDX);
    for (local_20 = 0; local_20 < iVar1; local_20 = local_20 + 1) {
      GmfSetLin(in_RDI,0x7e,(ulong)*(uint *)(in_RSI + (long)local_20 * 4));
    }
    if (local_24 != 0) {
      local_24 = 0;
      for (local_20 = 0; local_20 < (int)in_EDX % 4; local_20 = local_20 + 1) {
        local_24 = (int)*(char *)(in_RSI + (iVar1 * 4 + local_20)) << ((byte)(local_20 << 3) & 0x1f)
                   | local_24;
      }
      GmfSetLin(in_RDI,0x7e,(ulong)local_24);
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int GmfWriteByteFlow(int64_t MshIdx, char *BytTab, int NmbByt)
{
   int i, PadWrd = 0, *WrdTab = (int *)BytTab, NmbWrd = NmbByt / WrdSiz;

   // Add an extra padding word at the end if needed
   if(NmbByt > NmbWrd * 4)
      PadWrd = 1;

   // Create the keyword with the number of words, not bytes
   if(!GmfSetKwd(MshIdx, GmfByteFlow, NmbWrd + PadWrd))
      return(0);

   // Reacord the exact number of bytes
   GmfSetLin(MshIdx, GmfByteFlow, NmbByt);

   // Write the byteflow as 4-byte words, missing up to 3 endding bytes
   for(i=0;i<NmbWrd;i++)
      GmfSetLin(MshIdx, GmfByteFlow, WrdTab[i]);

   // Write the extra 1,2 or 3 ending bytes
   if(PadWrd)
   {
      PadWrd = 0;

      // Copy the last bytes in an integer
      for(i=0; i<NmbByt - NmbWrd * 4; i++)
         PadWrd |= BytTab[ NmbWrd * 4 + i ] << (i*8);

      // And write it as the last line
      GmfSetLin(MshIdx, GmfByteFlow, PadWrd);
   }

   return(1);
}